

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

char * UpnpGetServerIp6Address(void)

{
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if (UpnpSdkInit == 1) {
    pcVar1 = gIF_IPV6;
  }
  return pcVar1;
}

Assistant:

char *UpnpGetServerIp6Address(void)
{
#ifdef UPNP_ENABLE_IPV6
	if (UpnpSdkInit != 1)
		return NULL;

	return gIF_IPV6;
#else
	return NULL;
#endif
}